

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O0

void __thiscall mp::NLSolver::NLSolver(NLSolver *this,NLUtils *put)

{
  NLUtils *in_RSI;
  NLUtils *in_RDI;
  PreprocessData *this_00;
  NLUtils *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  allocator<char> local_11;
  NLUtils *local_10;
  
  local_10 = in_RSI;
  NLUtils::NLUtils(in_RDI);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 1);
  __a = in_RDI;
  if (local_10 != (NLUtils *)0x0) {
    __a = local_10;
  }
  *(NLUtils **)this_01 = __a;
  this_00 = (PreprocessData *)&in_RDI[1].show_fln_;
  std::__cxx11::string::string((string *)this_00);
  std::__cxx11::string::string((string *)&in_RDI[3].show_fln_);
  in_RDI[5].show_fln_ = false;
  std::unique_ptr<mp::NLHeader,std::default_delete<mp::NLHeader>>::
  unique_ptr<std::default_delete<mp::NLHeader>,void>
            ((unique_ptr<mp::NLHeader,_std::default_delete<mp::NLHeader>_> *)this_00);
  NLModel::PreprocessData::PreprocessData(this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)in_RDI,(allocator<char> *)__a);
  std::allocator<char>::~allocator(&local_11);
  *(undefined4 *)&in_RDI[0xc]._vptr_NLUtils = 0;
  *(undefined4 *)((long)&in_RDI[0xc]._vptr_NLUtils + 4) = 0xffffffff;
  return;
}

Assistant:

NLSolver::NLSolver(mp::NLUtils* put)
  : p_ut_(put ? put : &utils_) { }